

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sync_common.hpp
# Opt level: O0

void __thiscall
oqpi::local_sync_object<oqpi::posix_semaphore>::local_sync_object<int&,int&>
          (local_sync_object<oqpi::posix_semaphore> *this,int *args,int *args_1)

{
  allocator<char> local_41;
  string local_40;
  int32_t *local_20;
  int *args_local_1;
  int *args_local;
  local_sync_object<oqpi::posix_semaphore> *this_local;
  
  local_20 = args_1;
  args_local_1 = args;
  args_local = (int *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"",&local_41);
  posix_semaphore::posix_semaphore
            (&this->super_posix_semaphore,&local_40,open_or_create,*args_local_1,*local_20);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  return;
}

Assistant:

local_sync_object(_Args &&...args)
            : _Impl("", sync_object_creation_options::open_or_create, std::forward<_Args>(args)...)
        {}